

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::format(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
         *this)

{
  byte *end;
  basic_buffer<char> *this_00;
  iterator it;
  char *end_00;
  type tVar1;
  byte bVar2;
  uint arg_index;
  uint uVar3;
  byte *pbVar4;
  format_error *this_01;
  iterator it_00;
  iterator local_a0;
  format_specs local_8c;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_78
  ;
  format_arg arg;
  
  pbVar4 = (byte *)(this->
                   super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                   ).parse_context_.format_str_.data_;
  this_00 = (this->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            ).out_.container;
  local_a0.end_ =
       (char *)(pbVar4 + (this->
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         ).parse_context_.format_str_.size_);
  local_a0.ptr_ = (char *)pbVar4;
  do {
    while( true ) {
      do {
        end_00 = local_a0.ptr_;
        if ((local_a0.ptr_ == local_a0.end_) || (*local_a0.ptr_ == 0)) {
          internal::basic_buffer<char>::append<char>(this_00,(char *)pbVar4,local_a0.ptr_);
          return;
        }
        end = (byte *)(local_a0.ptr_ + 1);
        bVar2 = *local_a0.ptr_;
        local_a0.ptr_ = (char *)end;
      } while (bVar2 != 0x25);
      if ((end == (byte *)local_a0.end_) || (*end != 0x25)) break;
      internal::basic_buffer<char>::append<char>(this_00,(char *)pbVar4,(char *)end);
      pbVar4 = (byte *)(local_a0.ptr_ + 1);
      local_a0.ptr_ = (char *)pbVar4;
    }
    internal::basic_buffer<char>::append<char>(this_00,(char *)pbVar4,end_00);
    local_8c.super_align_spec.width_ = 0;
    local_8c.super_align_spec.fill_ = L' ';
    local_8c.super_align_spec.align_ = ALIGN_RIGHT;
    local_8c.super_core_format_specs.precision = -1;
    local_8c.super_core_format_specs.flags = '\0';
    local_8c.super_core_format_specs.type = '\0';
    arg_index = parse_header(this,&local_a0,&local_8c);
    if ((local_a0.ptr_ != local_a0.end_) && (*local_a0.ptr_ == 0x2e)) {
      pbVar4 = (byte *)(local_a0.ptr_ + 1);
      if (pbVar4 == (byte *)local_a0.end_) {
LAB_00124e56:
        local_8c._8_8_ = local_8c._8_8_ & 0xffffffff;
        local_a0.ptr_ = (char *)pbVar4;
      }
      else {
        bVar2 = *pbVar4;
        if ((char)bVar2 < '0') {
          if (bVar2 != 0x2a) goto LAB_00124e56;
          it_00.ptr_ = (byte *)(local_a0.ptr_ + 2);
          it_00.end_ = local_a0.end_;
          local_a0.ptr_ = (char *)it_00.ptr_;
          get_arg(&arg,this,it_00,0xffffffff);
          uVar3 = visit_format_arg<fmt::v5::internal::printf_precision_handler,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                            ((printf_precision_handler *)&local_78,
                             (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                              *)&arg);
        }
        else {
          if (0x39 < bVar2) goto LAB_00124e56;
          local_a0.ptr_ = (char *)pbVar4;
          uVar3 = internal::
                  parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::error_handler&>
                            (&local_a0,(error_handler *)&arg);
        }
        local_8c.super_core_format_specs.precision = uVar3;
      }
    }
    it.end_ = local_a0.end_;
    it.ptr_ = local_a0.ptr_;
    get_arg(&arg,this,it,arg_index);
    if (((local_8c.super_core_format_specs._4_2_ & 8) != 0) &&
       (tVar1 = visit_format_arg<fmt::v5::internal::is_zero_int,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                          ((is_zero_int *)&local_78,
                           (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                            *)&arg), tVar1)) {
      local_8c.super_core_format_specs._4_2_ = local_8c.super_core_format_specs._4_2_ & 0xfff7;
    }
    if (local_8c.super_align_spec.fill_ == L'0') {
      if (arg.type_ - named_arg_type < 9) {
        local_8c.super_align_spec.align_ = 4;
      }
      else {
        local_8c.super_align_spec.fill_ = L' ';
      }
    }
    pbVar4 = (byte *)(local_a0.ptr_ + 1);
    if (local_a0.ptr_ == local_a0.end_) {
      bVar2 = 0;
LAB_00124f27:
      internal::
      convert_arg<void,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                  *)&arg,bVar2);
      pbVar4 = (byte *)local_a0.ptr_;
    }
    else {
      bVar2 = *local_a0.ptr_;
      if (bVar2 != 0x4c) {
        if (bVar2 == 0x7a) {
          if (pbVar4 == (byte *)local_a0.end_) {
            bVar2 = 0;
          }
          else {
            bVar2 = *pbVar4;
          }
          local_a0.ptr_ = (char *)pbVar4;
          internal::
          convert_arg<unsigned_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                    ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                      *)&arg,bVar2);
          pbVar4 = (byte *)local_a0.ptr_;
        }
        else {
          if (bVar2 == 0x6a) {
LAB_00124f37:
            if (pbVar4 == (byte *)local_a0.end_) {
              bVar2 = 0;
            }
            else {
              bVar2 = *pbVar4;
            }
          }
          else {
            if (bVar2 != 0x6c) {
              if (bVar2 != 0x74) {
                if (bVar2 != 0x68) {
                  bVar2 = *local_a0.ptr_;
                  goto LAB_00124f27;
                }
                if (pbVar4 == (byte *)local_a0.end_) {
                  bVar2 = 0;
                }
                else {
                  bVar2 = *pbVar4;
                  if (bVar2 == 0x68) {
                    local_a0.ptr_ = local_a0.ptr_ + 2;
                    if (local_a0.ptr_ == local_a0.end_) {
                      bVar2 = 0;
                    }
                    else {
                      bVar2 = *local_a0.ptr_;
                    }
                    internal::
                    convert_arg<signed_char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                              ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                                *)&arg,bVar2);
                    pbVar4 = (byte *)local_a0.ptr_;
                    goto LAB_00124fc0;
                  }
                }
                local_a0.ptr_ = (char *)pbVar4;
                internal::
                convert_arg<short,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                          ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                            *)&arg,bVar2);
                pbVar4 = (byte *)local_a0.ptr_;
                goto LAB_00124fc0;
              }
              goto LAB_00124f37;
            }
            if (pbVar4 == (byte *)local_a0.end_) {
              bVar2 = 0;
            }
            else {
              bVar2 = *pbVar4;
              if (bVar2 == 0x6c) {
                local_a0.ptr_ = local_a0.ptr_ + 2;
                if (local_a0.ptr_ == local_a0.end_) {
                  bVar2 = 0;
                }
                else {
                  bVar2 = *local_a0.ptr_;
                }
                internal::
                convert_arg<long_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                          ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                            *)&arg,bVar2);
                pbVar4 = (byte *)local_a0.ptr_;
                goto LAB_00124fc0;
              }
            }
          }
          local_a0.ptr_ = (char *)pbVar4;
          internal::
          convert_arg<long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                    ((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                      *)&arg,bVar2);
          pbVar4 = (byte *)local_a0.ptr_;
        }
      }
    }
LAB_00124fc0:
    local_a0.ptr_ = (char *)pbVar4;
    if ((local_a0.ptr_ == local_a0.end_) || (*local_a0.ptr_ == 0)) {
      this_01 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this_01,"invalid format string");
      __cxa_throw(this_01,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar4 = (byte *)(local_a0.ptr_ + 1);
    bVar2 = *local_a0.ptr_;
    local_8c.super_core_format_specs.type = bVar2;
    local_a0.ptr_ = (char *)pbVar4;
    if (arg.type_ - named_arg_type < 7) {
      if (bVar2 == 99) {
        local_78.
        super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
        .writer_.out_.container = (basic_buffer<char> *)&arg;
        visit_format_arg<fmt::v5::internal::char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                  ((char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                    *)&local_78,
                   (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                    *)&arg);
      }
      else if ((bVar2 == 0x75) || (bVar2 == 0x69)) {
        local_8c.super_core_format_specs.type = 'd';
      }
    }
    pbVar4 = (byte *)local_a0.ptr_;
    local_78.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.locale_.locale_ =
         (this->
         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
         ).loc_.locale_;
    local_78.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    writer_.out_.container = this_00;
    local_78.
    super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
    specs_ = &local_8c;
    local_78.context_ = this;
    visit_format_arg<fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
              (&local_78,
               (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                *)&arg);
  } while( true );
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::format() {
  auto &buffer = internal::get_container(this->out());
  auto start = iterator(this->parse_context());
  auto it = start;
  using internal::pointer_from;
  while (*it) {
    char_type c = *it++;
    if (c != '%') continue;
    if (*it == c) {
      buffer.append(pointer_from(start), pointer_from(it));
      start = ++it;
      continue;
    }
    buffer.append(pointer_from(start), pointer_from(it) - 1);

    format_specs spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(it, spec);

    // Parse precision.
    if (*it == '.') {
      ++it;
      if ('0' <= *it && *it <= '9') {
        internal::error_handler eh;
        spec.precision = static_cast<int>(parse_nonnegative_int(it, eh));
      } else if (*it == '*') {
        ++it;
        spec.precision =
            visit_format_arg(internal::printf_precision_handler(), get_arg(it));
      } else {
        spec.precision = 0;
      }
    }

    format_arg arg = get_arg(it, arg_index);
    if (spec.has(HASH_FLAG) && visit_format_arg(internal::is_zero_int(), arg))
      spec.flags = static_cast<uint_least8_t>(spec.flags & (~internal::to_unsigned<int>(HASH_FLAG)));
    if (spec.fill_ == '0') {
      if (arg.is_arithmetic())
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    using internal::convert_arg;
    switch (*it++) {
    case 'h':
      if (*it == 'h')
        convert_arg<signed char>(arg, *++it);
      else
        convert_arg<short>(arg, *it);
      break;
    case 'l':
      if (*it == 'l')
        convert_arg<long long>(arg, *++it);
      else
        convert_arg<long>(arg, *it);
      break;
    case 'j':
      convert_arg<intmax_t>(arg, *it);
      break;
    case 'z':
      convert_arg<std::size_t>(arg, *it);
      break;
    case 't':
      convert_arg<std::ptrdiff_t>(arg, *it);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --it;
      convert_arg<void>(arg, *it);
    }

    // Parse type.
    if (!*it)
      FMT_THROW(format_error("invalid format string"));
    spec.type = static_cast<char>(*it++);
    if (arg.is_integral()) {
      // Normalize type.
      switch (spec.type) {
      case 'i': case 'u':
        spec.type = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t better?
        visit_format_arg(
              internal::char_converter<basic_printf_context>(arg), arg);
        break;
      }
    }

    start = it;

    // Format argument.
    visit_format_arg(AF(buffer, spec, *this), arg);
  }
  buffer.append(pointer_from(start), pointer_from(it));
}